

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.hpp
# Opt level: O2

char * trial::protocol::json::detail::scan_whitespace<char>(char *marker,char *tail)

{
  byte *pbVar1;
  
  while ((pbVar1 = (byte *)tail, marker != tail &&
         (pbVar1 = (byte *)marker, (traits::flags<char>(char)::data[(byte)*marker] & 1) != 0))) {
    marker = (char *)((byte *)marker + 1);
  }
  return (char *)pbVar1;
}

Assistant:

auto scan_whitespace(const CharT *marker,
                     const CharT * const tail) noexcept -> const CharT *
{
    while (marker != tail)
    {
        if (traits::is_space(*marker))
        {
            ++marker;
        }
        else
            break;
    }
    return marker;
}